

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Minisat::SimpSolver::addClause_(SimpSolver *this,vec<Minisat::Lit,_int> *ps)

{
  int *piVar1;
  int iVar2;
  uint elem;
  bool bVar3;
  int iVar4;
  uint *puVar5;
  int i;
  ulong uVar6;
  CRef cr;
  uint local_34;
  
  iVar4 = (this->super_Solver).clauses.sz;
  if ((this->use_rcheck == true) && (bVar3 = implied(this,ps), bVar3)) {
    return true;
  }
  bVar3 = Solver::addClause_(&this->super_Solver,ps);
  if (bVar3) {
    bVar3 = true;
    if ((this->use_simplification == true) &&
       (iVar2 = (this->super_Solver).clauses.sz, iVar2 == iVar4 + 1)) {
      elem = (this->super_Solver).clauses.data[(long)iVar2 + -1];
      puVar5 = (this->super_Solver).ca.ra.memory + elem;
      Queue<unsigned_int>::insert(&this->subsumption_queue,elem);
      for (uVar6 = 0; uVar6 < *puVar5 >> 5; uVar6 = uVar6 + 1) {
        vec<unsigned_int,_int>::push
                  ((this->occurs).occs.map.data + ((int)puVar5[uVar6 + 1] >> 1),&local_34);
        piVar1 = (this->n_occ).super_IntMap<Minisat::Lit,_int,_Minisat::MkIndexLit>.map.data +
                 (int)puVar5[uVar6 + 1];
        *piVar1 = *piVar1 + 1;
        (this->touched).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
        [(int)puVar5[uVar6 + 1] >> 1] = '\x01';
        this->n_touched = this->n_touched + 1;
        iVar4 = (int)puVar5[uVar6 + 1] >> 1;
        if ((iVar4 < (this->elim_heap).indices.map.sz) &&
           (-1 < (this->elim_heap).indices.map.data[iVar4])) {
          Heap<int,_Minisat::SimpSolver::ElimLt,_Minisat::MkIndexDefault<int>_>::increase
                    (&this->elim_heap,iVar4);
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool SimpSolver::addClause_(vec<Lit>& ps)
{
#ifndef NDEBUG
    for (int i = 0; i < ps.size(); i++)
        assert(!isEliminated(var(ps[i])));
#endif

    int nclauses = clauses.size();

    if (use_rcheck && implied(ps))
        return true;

    if (!Solver::addClause_(ps))
        return false;

    if (use_simplification && clauses.size() == nclauses + 1){
        CRef          cr = clauses.last();
        const Clause& c  = ca[cr];

        // NOTE: the clause is added to the queue immediately and then
        // again during 'gatherTouchedClauses()'. If nothing happens
        // in between, it will only be checked once. Otherwise, it may
        // be checked twice unnecessarily. This is an unfortunate
        // consequence of how backward subsumption is used to mimic
        // forward subsumption.
        subsumption_queue.insert(cr);
        for (int i = 0; i < c.size(); i++){
            occurs[var(c[i])].push(cr);
            n_occ[c[i]]++;
            touched[var(c[i])] = 1;
            n_touched++;
            if (elim_heap.inHeap(var(c[i])))
                elim_heap.increase(var(c[i]));
        }
    }

    return true;
}